

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  undefined1 (*pauVar2) [16];
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  parasail_result_t *ppVar36;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  int iVar40;
  size_t len;
  size_t __n;
  long lVar41;
  long lVar42;
  void *pvVar43;
  void *pvVar44;
  ulong uVar45;
  char *pcVar46;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  long lVar47;
  int iVar48;
  ulong uVar49;
  long lVar50;
  longlong lVar51;
  __m128i *palVar52;
  __m128i *palVar53;
  char *__format;
  __m128i *palVar54;
  ulong uVar55;
  int iVar56;
  longlong lVar57;
  int iVar58;
  size_t sVar59;
  ulong uVar60;
  longlong lVar61;
  long lVar62;
  undefined1 auVar63 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar64;
  long lVar80;
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar65 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 auVar68 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 auVar69 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 auVar70 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_XMM0_07 [16];
  long lVar81;
  long lVar82;
  undefined1 auVar83 [16];
  long lVar90;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  ulong uVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128i alVar94;
  undefined1 auVar95 [16];
  ulong uVar96;
  undefined1 auVar97 [16];
  __m128i_64_t B;
  __m128i_64_t B_2;
  longlong lVar99;
  undefined1 auVar98 [16];
  __m128i_64_t B_1;
  undefined1 auVar100 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  int local_33c;
  undefined1 local_338 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  long local_280;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_228 [16];
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  long local_1d0;
  undefined1 local_1b8 [16];
  long lStack_170;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong uStack_120;
  undefined8 uStack_90;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar46 = "profile";
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar46 = "profile->profile64.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar46 = "profile->matrix";
      }
      else {
        uVar55 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar46 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar46 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar46 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar46 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar5 = (profile->profile64).matches;
            iVar48 = ppVar4->min;
            uVar49 = 0x8000000000000000 - (long)iVar48;
            if (iVar48 != -open && SBORROW4(iVar48,-open) == iVar48 + open < 0) {
              uVar49 = (ulong)(uint)open | 0x8000000000000000;
            }
            pvVar6 = (profile->profile64).similar;
            iVar48 = ppVar4->max;
            ppVar36 = parasail_result_new_table3((uint)(uVar55 + 1) & 0x7ffffffe,s2Len);
            if (ppVar36 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            palVar52 = (__m128i *)(uVar55 + 1 >> 1);
            ppVar36->flag = ppVar36->flag | 0x2830404;
            b = parasail_memalign___m128i(0x10,(size_t)palVar52);
            b_00 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            b_01 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            b_02 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            b_03 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            b_04 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            b_05 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            b_06 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            ptr = parasail_memalign___m128i(0x10,(size_t)palVar52);
            ptr_00 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            ptr_01 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            ptr_02 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            ptr_03 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            ptr_04 = parasail_memalign___m128i(0x10,(size_t)palVar52);
            auVar63._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar63._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar92._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar92._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar63 = packssdw(auVar63,auVar92);
            auVar84._0_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar84._8_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar85._0_8_ = -(ulong)(b_05 == (__m128i *)0x0);
            auVar85._8_8_ = -(ulong)(b_06 == (__m128i *)0x0);
            auVar92 = packssdw(auVar84,auVar85);
            auVar63 = packssdw(auVar63,auVar92);
            if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar63 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar63 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_03 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_04 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar45 = (ulong)(uint)gap;
            lVar37 = uVar49 + 1;
            local_148._0_8_ = 0x7ffffffffffffffe - (long)iVar48;
            auVar87._8_4_ = (int)lVar37;
            auVar87._0_8_ = lVar37;
            auVar87._12_4_ = (int)((ulong)lVar37 >> 0x20);
            auVar93._8_4_ = (int)local_148._0_8_;
            auVar93._0_8_ = local_148._0_8_;
            auVar93._12_4_ = (int)((ulong)local_148._0_8_ >> 0x20);
            c[1] = extraout_RDX;
            c[0] = (longlong)palVar52;
            len = local_148._0_8_;
            parasail_memset___m128i(b_03,c,local_148._0_8_);
            c_00[1] = extraout_RDX_00;
            c_00[0] = (longlong)palVar52;
            parasail_memset___m128i(b_04,c_00,len);
            c_01[1] = extraout_RDX_01;
            c_01[0] = (longlong)palVar52;
            parasail_memset___m128i(b_05,c_01,len);
            c_02[1] = extraout_RDX_02;
            c_02[0] = (longlong)palVar52;
            parasail_memset___m128i(b_06,c_02,len);
            c_03[1] = extraout_RDX_03;
            c_03[0] = (longlong)palVar52;
            parasail_memset___m128i(b,c_03,len);
            c_04[1] = extraout_RDX_04;
            c_04[0] = (longlong)palVar52;
            parasail_memset___m128i(b_00,c_04,len);
            c_05[1] = extraout_RDX_05;
            c_05[0] = (longlong)palVar52;
            parasail_memset___m128i(b_01,c_05,len);
            c_06[1] = extraout_RDX_06;
            c_06[0] = (longlong)palVar52;
            palVar53 = palVar52;
            palVar54 = b_02;
            parasail_memset___m128i(b_02,c_06,len);
            alVar94[1] = -(ulong)(uint)open;
            alVar94[0] = -(ulong)(uint)open;
            uVar7 = (uint)palVar52;
            uVar35 = uVar7 - 1;
            alVar64 = (__m128i)pmovsxbq(extraout_XMM0,0x101);
            auVar83._8_4_ = 0xffffffff;
            auVar83._0_8_ = 0xffffffffffffffff;
            auVar83._12_4_ = 0xffffffff;
            for (uVar39 = uVar35; lVar41 = alVar64[1], -1 < (int)uVar39; uVar39 = uVar39 - 1) {
              ptr_03[uVar39] = alVar94;
              ptr_04[uVar39] = alVar64;
              uStack_120 = (ulong)(uint)gap;
              lVar47 = alVar94[1];
              alVar94[0] = alVar94[0] - uVar45;
              alVar94[1] = lVar47 - uStack_120;
              alVar64[0] = alVar64[0] + 1;
              alVar64[1] = lVar41 - auVar83._8_8_;
              palVar53 = ptr_04;
            }
            uVar38 = (ulong)(uint)s2Len;
            __n = (long)palVar52 << 4;
            lVar41 = (long)palVar52 * uVar38 * 4;
            local_1d0 = 0;
            uStack_90 = auVar93._8_8_;
            local_148._8_8_ = uStack_90;
            lStack_170 = auVar87._8_8_;
            local_138._8_8_ = lStack_170;
            local_138._0_8_ = lVar37;
            local_33c = 0;
            local_268._0_8_ = lVar37;
            local_268._8_8_ = lStack_170;
            local_280 = lVar37;
            for (uVar60 = 0; uVar60 != uVar38; uVar60 = uVar60 + 1) {
              lVar42 = (long)(int)(ppVar4->mapper[(byte)s2[uVar60]] * uVar7) * 0x10;
              pvVar43 = (void *)(lVar42 + (long)pvVar6);
              local_2c8 = ZEXT816(0);
              auVar63 = (undefined1  [16])0x0;
              sVar59 = 0;
              local_2e8 = ZEXT816(0);
              local_2d8 = ZEXT816(0);
              pvVar44 = pvVar43;
              lVar47 = 0;
              lVar51 = b_04[uVar35][0];
              lVar50 = 0;
              lVar57 = b_05[uVar35][0];
              local_1b8._0_8_ = 0;
              lVar61 = b_03[uVar35][0];
              lVar81 = lVar37;
              lVar90 = lStack_170;
              lVar82 = 0;
              lVar99 = b_06[uVar35][0];
              while( true ) {
                uVar96 = auVar63._0_8_;
                uVar91 = alVar94[0];
                uStack_120 = (ulong)(uint)gap;
                if (__n == sVar59) break;
                plVar1 = (long *)((long)*b_03 + sVar59);
                lVar8 = *plVar1;
                lVar9 = plVar1[1];
                pauVar2 = (undefined1 (*) [16])((long)*b_04 + sVar59);
                lVar16 = *(long *)*pauVar2;
                lVar17 = *(long *)(*pauVar2 + 8);
                auVar87 = *pauVar2;
                pauVar2 = (undefined1 (*) [16])((long)*b_05 + sVar59);
                lVar18 = *(long *)*pauVar2;
                lVar19 = *(long *)(*pauVar2 + 8);
                auVar93 = *pauVar2;
                pauVar2 = (undefined1 (*) [16])((long)*b_06 + sVar59);
                lVar20 = *(long *)*pauVar2;
                lVar21 = *(long *)(*pauVar2 + 8);
                auVar92 = *pauVar2;
                plVar1 = (long *)((long)*b + sVar59);
                auVar84 = *(undefined1 (*) [16])((long)*b_00 + sVar59);
                auVar85 = *(undefined1 (*) [16])((long)*b_01 + sVar59);
                auVar83 = *(undefined1 (*) [16])((long)*b_02 + sVar59);
                lVar62 = lVar8 - (ulong)(uint)open;
                lVar80 = lVar9 - (ulong)(uint)open;
                local_228._0_8_ = *plVar1 - uVar45;
                local_228._8_8_ = plVar1[1] - uStack_120;
                plVar1 = (long *)((long)*ptr_03 + sVar59);
                local_338._0_8_ = uVar96 + *plVar1;
                local_338._8_8_ = auVar63._8_8_ + plVar1[1];
                plVar1 = (long *)((long)*ptr_04 + sVar59);
                lVar10 = *plVar1;
                lVar11 = plVar1[1];
                plVar1 = (long *)((long)pvVar3 + sVar59 + lVar42);
                local_1b8._0_8_ = local_1b8._0_8_ + *plVar1;
                local_1b8._8_8_ = lVar61 + plVar1[1];
                plVar1 = (long *)((long)pvVar5 + sVar59 + lVar42);
                lVar12 = *plVar1;
                lVar13 = plVar1[1];
                plVar1 = (long *)((long)pvVar43 + sVar59);
                lVar14 = *plVar1;
                lVar15 = plVar1[1];
                b_07[1] = (longlong)pvVar44;
                b_07[0] = (longlong)b_03;
                a[1] = (longlong)palVar53;
                a[0] = (longlong)palVar54;
                alVar64 = _mm_cmpgt_epi64_rpl(a,b_07);
                b_08[0] = alVar64[1];
                auVar84 = pblendvb(auVar84,auVar87,extraout_XMM0_00);
                auVar85 = pblendvb(auVar85,auVar93,extraout_XMM0_00);
                auVar92 = pblendvb(auVar83,auVar92,extraout_XMM0_00);
                auVar65._8_4_ = 0xffffffff;
                auVar65._0_8_ = 0xffffffffffffffff;
                auVar65._12_4_ = 0xffffffff;
                b_08[1] = (longlong)pvVar44;
                a_00[1] = (longlong)palVar53;
                a_00[0] = (longlong)palVar54;
                alVar64 = _mm_cmpgt_epi64_rpl(a_00,b_08);
                b_09[0] = alVar64[1];
                auVar22._8_8_ = lVar90;
                auVar22._0_8_ = lVar81;
                auVar86._0_8_ = -(ulong)(lVar81 == local_338._0_8_);
                auVar86._8_8_ = -(ulong)(lVar90 == local_338._8_8_);
                auVar86 = extraout_XMM0_01 | auVar86;
                auVar66._0_8_ = -(ulong)((long)local_338._0_8_ < lVar81);
                auVar66._8_8_ = -(ulong)((long)local_338._8_8_ < lVar90);
                auVar93 = blendvpd(local_338,auVar22,auVar66);
                local_2c8 = pblendvb(local_248,local_2c8,auVar86);
                local_2e8 = pblendvb(local_258,local_2e8,auVar86);
                auVar25._8_8_ = alVar94[1] + lVar11;
                auVar25._0_8_ = uVar91 + lVar10;
                local_2d8 = pblendvb(auVar25,local_2d8,auVar86);
                auVar26._8_8_ = lVar80;
                auVar26._0_8_ = lVar62;
                auVar67._0_8_ = -(ulong)((long)local_228._0_8_ < lVar62);
                auVar67._8_8_ = -(ulong)((long)local_228._8_8_ < lVar80);
                auVar87 = blendvpd(local_228,auVar26,auVar67);
                b_09[1] = (longlong)pvVar44;
                a_01[1] = (longlong)palVar53;
                a_01[0] = (longlong)palVar54;
                _mm_cmpgt_epi64_rpl(a_01,b_09);
                auVar68._0_8_ = -(ulong)((long)local_1b8._0_8_ < auVar87._0_8_);
                auVar68._8_8_ = -(ulong)((long)local_1b8._8_8_ < auVar87._8_8_);
                auVar63 = blendvpd(local_1b8,auVar87,auVar68);
                auVar27._8_8_ = lVar51 + lVar13;
                auVar27._0_8_ = lVar47 + lVar12;
                local_248 = pblendvb(auVar27,auVar84,extraout_XMM0_02);
                auVar28._8_8_ = lVar57 + lVar15;
                auVar28._0_8_ = lVar50 + lVar14;
                local_258 = pblendvb(auVar28,auVar85,extraout_XMM0_02);
                auVar24._8_8_ = lVar99 + 1;
                auVar24._0_8_ = lVar82 + 1;
                auVar23._8_8_ = auVar92._8_8_ - auVar65._8_8_;
                auVar23._0_8_ = auVar92._0_8_ + 1;
                alVar94 = (__m128i)pblendvb(auVar24,auVar23,extraout_XMM0_02);
                *(undefined1 (*) [16])((long)*b + sVar59) = auVar87;
                *(undefined1 (*) [16])((long)*b_00 + sVar59) = auVar84;
                *(undefined1 (*) [16])((long)*b_01 + sVar59) = auVar85;
                *(undefined1 (*) [16])((long)*b_02 + sVar59) = auVar23;
                *(undefined1 (*) [16])((long)*b_03 + sVar59) = local_1b8;
                *(undefined1 (*) [16])((long)*b_04 + sVar59) = auVar27;
                *(undefined1 (*) [16])((long)*b_05 + sVar59) = auVar28;
                *(undefined1 (*) [16])((long)*b_06 + sVar59) = auVar24;
                sVar59 = sVar59 + 0x10;
                local_338._0_8_ = auVar93._0_8_;
                local_338._8_8_ = auVar93._8_8_;
                lVar47 = lVar16;
                lVar51 = lVar17;
                lVar50 = lVar18;
                lVar57 = lVar19;
                local_1b8._0_8_ = lVar8;
                lVar61 = lVar9;
                lVar81 = local_338._0_8_;
                lVar90 = local_338._8_8_;
                lVar82 = lVar20;
                lVar99 = lVar21;
              }
              auVar29._8_8_ = 0;
              auVar29._0_8_ = uVar96;
              local_338 = auVar29 << 0x40;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = local_248._0_8_;
              local_248 = auVar30 << 0x40;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = local_258._0_8_;
              local_258 = auVar31 << 0x40;
              local_2f8._8_8_ = (*ptr_03)[0];
              lVar47 = (*ptr_03)[1];
              alVar94 = *ptr_04;
              b_10[1] = (longlong)pvVar44;
              b_10[0] = (longlong)b_03;
              a_02[1] = (longlong)palVar53;
              a_02[0] = (longlong)palVar54;
              alVar64 = _mm_cmpgt_epi64_rpl(a_02,b_10);
              b_11[0] = alVar64[1];
              auVar69._0_8_ = -(ulong)(local_2f8._8_8_ == lVar81);
              auVar69._8_8_ = -(ulong)(lVar47 + uVar96 == lVar90);
              if ((long)local_2f8._8_8_ < lVar81) {
                local_2f8._8_8_ = lVar81;
              }
              auVar69 = extraout_XMM0_03 | auVar69;
              auVar63 = pblendvb(local_2c8,local_248,auVar69);
              auVar84 = pblendvb(local_2e8,local_258,auVar69);
              auVar92 = pblendvb(local_2d8,(undefined1  [16])alVar94,auVar69);
              local_2c8._8_8_ = 0;
              local_2c8._0_8_ = auVar63._0_8_;
              local_2c8 = local_2c8 << 0x40;
              local_2e8._8_8_ = 0;
              local_2e8._0_8_ = auVar84._0_8_;
              local_2e8 = local_2e8 << 0x40;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = auVar92._0_8_;
              local_2d8 = auVar32 << 0x40;
              local_2f8._0_8_ = lVar37;
              b_11[1] = lVar81;
              a_03[1] = (longlong)palVar53;
              a_03[0] = (longlong)palVar54;
              alVar94 = _mm_cmpgt_epi64_rpl(a_03,b_11);
              auVar70._0_8_ = -(ulong)(0 < lVar37);
              auVar70._8_8_ = -(ulong)((long)uVar96 < (long)local_2f8._8_8_);
              auVar97 = blendvpd(local_338,local_2f8,auVar70);
              auVar84 = pblendvb(local_248,local_2c8,extraout_XMM0_04);
              auVar92 = pblendvb(local_258,local_2e8,extraout_XMM0_04);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar91;
              auVar63 = pblendvb(auVar33 << 0x40,local_2d8,extraout_XMM0_04);
              sVar59 = 0;
              lVar47 = alVar94[1];
              lVar50 = local_1d0;
              while( true ) {
                if (__n == sVar59) break;
                pauVar2 = (undefined1 (*) [16])((long)*b_03 + sVar59);
                lVar81 = *(long *)*pauVar2;
                lVar90 = *(long *)(*pauVar2 + 8);
                auVar93 = *pauVar2;
                auVar29 = *(undefined1 (*) [16])((long)*b_04 + sVar59);
                auVar30 = *(undefined1 (*) [16])((long)*b_05 + sVar59);
                auVar85 = *(undefined1 (*) [16])((long)*b_06 + sVar59);
                auVar83 = *(undefined1 (*) [16])((long)*b_00 + sVar59);
                auVar87 = *(undefined1 (*) [16])((long)*b_01 + sVar59);
                auVar31 = *(undefined1 (*) [16])((long)*b_02 + sVar59);
                local_338._0_8_ = auVar97._0_8_ - (ulong)(uint)open;
                local_338._8_8_ = auVar97._8_8_ - (ulong)(uint)open;
                lVar82 = local_2f8._0_8_ - uVar45;
                local_2f8._8_8_ = local_2f8._8_8_ - uStack_120;
                local_2f8._0_8_ = lVar82;
                b_12[1] = (longlong)b_03;
                b_12[0] = lVar47;
                a_04[1] = (longlong)palVar53;
                a_04[0] = (longlong)palVar54;
                _mm_cmpgt_epi64_rpl(a_04,b_12);
                local_2c8 = pblendvb(local_2c8,auVar84,extraout_XMM0_05);
                local_2e8 = pblendvb(local_2e8,auVar92,extraout_XMM0_05);
                auVar69 = pblendvb(local_2d8,auVar63,extraout_XMM0_05);
                auVar71._0_8_ = -(ulong)(lVar82 < (long)local_338._0_8_);
                auVar71._8_8_ = -(ulong)((long)local_2f8._8_8_ < (long)local_338._8_8_);
                local_2f8 = blendvpd(local_2f8,local_338,auVar71);
                auVar63 = *(undefined1 (*) [16])((long)*b + sVar59);
                auVar72._0_8_ = -(ulong)(auVar63._0_8_ < lVar81);
                auVar72._8_8_ = -(ulong)(auVar63._8_8_ < lVar90);
                auVar63 = blendvpd(auVar63,auVar93,auVar72);
                auVar73._0_8_ = -(ulong)(local_2f8._0_8_ < auVar63._0_8_);
                auVar73._8_8_ = -(ulong)(local_2f8._8_8_ < auVar63._8_8_);
                auVar93 = blendvpd(local_2f8,auVar63,auVar73);
                auVar97._0_8_ = -(ulong)(0 < auVar93._0_8_);
                auVar97._8_8_ = -(ulong)(0 < auVar93._8_8_);
                auVar97 = auVar97 & auVar93;
                lVar82 = auVar97._0_8_;
                lVar42 = auVar97._8_8_;
                auVar88._0_8_ = -(ulong)(lVar82 == local_2f8._0_8_);
                auVar88._8_8_ = -(ulong)(lVar42 == local_2f8._8_8_);
                auVar63 = blendvpd(auVar83,local_2c8,auVar88);
                auVar100._0_8_ = -(ulong)(lVar81 == lVar82);
                auVar100._8_8_ = -(ulong)(lVar90 == lVar42);
                auVar84 = blendvpd(auVar63,auVar29,auVar100);
                auVar63 = blendvpd(auVar87,local_2e8,auVar88);
                auVar92 = blendvpd(auVar63,auVar30,auVar100);
                local_2d8._0_8_ = auVar69._0_8_ + 1;
                local_2d8._8_8_ = auVar69._8_8_ + 1;
                auVar63 = blendvpd(auVar31,local_2d8,auVar88);
                auVar63 = blendvpd(auVar63,auVar85,auVar100);
                auVar85 = pmovsxbq(local_2e8,0x101);
                auVar98._0_8_ = -(ulong)(auVar93._0_8_ < auVar85._0_8_);
                auVar98._8_8_ = -(ulong)(auVar93._8_8_ < auVar85._8_8_);
                auVar84 = ~auVar98 & auVar84;
                auVar92 = ~auVar98 & auVar92;
                auVar63 = ~auVar98 & auVar63;
                *(undefined1 (*) [16])((long)*b_03 + sVar59) = auVar97;
                *(undefined1 (*) [16])((long)*b_04 + sVar59) = auVar84;
                *(undefined1 (*) [16])((long)*b_05 + sVar59) = auVar92;
                auVar74._0_8_ = -(ulong)(local_148._0_8_ < lVar82);
                auVar74._8_8_ = -(ulong)(local_148._8_8_ < lVar42);
                local_148 = blendvpd(auVar97,local_148,auVar74);
                auVar75._0_8_ = -(ulong)(lVar82 < local_138._0_8_);
                auVar75._8_8_ = -(ulong)(lVar42 < local_138._8_8_);
                auVar85 = blendvpd(auVar97,local_138,auVar75);
                *(undefined1 (*) [16])((long)*b_06 + sVar59) = auVar63;
                auVar76._0_8_ = -(ulong)(auVar84._0_8_ < auVar85._0_8_);
                auVar76._8_8_ = -(ulong)(auVar84._8_8_ < auVar85._8_8_);
                auVar85 = blendvpd(auVar84,auVar85,auVar76);
                lVar47 = *((ppVar36->field_4).trace)->trace_del_table;
                *(int *)(lVar47 + lVar50) = auVar97._0_4_;
                *(int *)(lVar41 + lVar47 + lVar50) = auVar97._8_4_;
                auVar77._0_8_ = -(ulong)(auVar92._0_8_ < auVar85._0_8_);
                auVar77._8_8_ = -(ulong)(auVar92._8_8_ < auVar85._8_8_);
                lVar47 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 8);
                *(int *)(lVar47 + lVar50) = auVar84._0_4_;
                *(int *)(lVar41 + lVar47 + lVar50) = auVar84._8_4_;
                auVar85 = blendvpd(auVar92,auVar85,auVar77);
                lVar47 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x10);
                *(int *)(lVar47 + lVar50) = auVar92._0_4_;
                *(int *)(lVar41 + lVar47 + lVar50) = auVar92._8_4_;
                auVar78._0_8_ = -(ulong)(auVar63._0_8_ < auVar85._0_8_);
                auVar78._8_8_ = -(ulong)(auVar63._8_8_ < auVar85._8_8_);
                local_138 = blendvpd(auVar63,auVar85,auVar78);
                auVar79._0_8_ = -(ulong)((long)local_268._0_8_ < lVar82);
                auVar79._8_8_ = -(ulong)((long)local_268._8_8_ < lVar42);
                local_268 = blendvpd(local_268,auVar97,auVar79);
                lVar47 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x18);
                *(int *)(lVar47 + lVar50) = auVar63._0_4_;
                *(int *)(lVar41 + lVar47 + lVar50) = auVar63._8_4_;
                sVar59 = sVar59 + 0x10;
                lVar50 = lVar50 + uVar38 * 4;
                lVar47 = lVar41;
              }
              b_13[1] = (longlong)b_03;
              b_13[0] = lVar47;
              a_05[1] = (longlong)palVar53;
              a_05[0] = (longlong)palVar54;
              _mm_cmpgt_epi64_rpl(a_05,b_13);
              if ((((((((((((((((extraout_XMM0_06 >> 7 & (undefined1  [16])0x1) !=
                                (undefined1  [16])0x0 ||
                               (extraout_XMM0_06 >> 0xf & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0) ||
                              (extraout_XMM0_06 >> 0x17 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) ||
                             (extraout_XMM0_06 >> 0x1f & (undefined1  [16])0x1) !=
                             (undefined1  [16])0x0) ||
                            (extraout_XMM0_06 >> 0x27 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) ||
                           (extraout_XMM0_06 >> 0x2f & (undefined1  [16])0x1) !=
                           (undefined1  [16])0x0) ||
                          (extraout_XMM0_06 >> 0x37 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) ||
                         (extraout_XMM0_06 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                         ) || (extraout_XMM0_06 >> 0x47 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) ||
                       (extraout_XMM0_06 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                      || (extraout_XMM0_06 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                      ) || (extraout_XMM0_06 >> 0x5f & (undefined1  [16])0x1) !=
                           (undefined1  [16])0x0) ||
                    (extraout_XMM0_06 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (extraout_XMM0_06 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (extraout_XMM0_06 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  extraout_XMM0_06[0xf] < '\0') {
                local_280 = local_268._8_8_;
                if ((long)local_268._8_8_ < (long)local_268._0_8_) {
                  local_280 = local_268._0_8_;
                }
                memcpy(ptr,b_03,__n);
                memcpy(ptr_00,b_04,__n);
                memcpy(ptr_01,b_05,__n);
                palVar53 = b_06;
                palVar54 = ptr_02;
                memcpy(ptr_02,b_06,__n);
                local_33c = (int)uVar60;
              }
              local_1d0 = local_1d0 + 4;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar91;
              alVar94 = (__m128i)(auVar34 << 0x40);
            }
            uVar45 = 0;
            lVar51 = 0;
            lVar57 = 0;
            lVar61 = 0;
            palVar52 = b_03;
            while( true ) {
              iVar58 = (int)lVar61;
              iVar56 = (int)lVar57;
              iVar48 = (int)lVar51;
              if ((uVar7 & 0x3fffffff) * 2 == (int)uVar45) break;
              if ((*ptr)[uVar45] == local_280) {
                palVar53 = (__m128i *)(uVar45 >> 1 & 0x7fffffff);
                uVar39 = 0;
                if ((uVar45 & 1) != 0) {
                  uVar39 = uVar7;
                }
                uVar39 = uVar39 + (int)palVar53;
                palVar52 = (__m128i *)(ulong)uVar39;
                if ((int)uVar39 < (int)uVar55) {
                  lVar51 = (*ptr_00)[uVar45];
                  lVar57 = (*ptr_01)[uVar45];
                  lVar61 = (*ptr_02)[uVar45];
                  uVar55 = (ulong)uVar39;
                  palVar53 = ptr_02;
                }
              }
              uVar45 = uVar45 + 1;
            }
            local_1f8 = (undefined4)uVar49;
            uStack_1f4 = (undefined4)(uVar49 >> 0x20);
            local_338._8_4_ = local_1f8;
            local_338._0_8_ = uVar49;
            local_338._12_4_ = uStack_1f4;
            b_14[1] = uVar45;
            b_14[0] = (longlong)palVar52;
            a_06[1] = (longlong)palVar53;
            a_06[0] = uVar55;
            _mm_cmpgt_epi64_rpl(a_06,b_14);
            iVar40 = (int)local_280;
            auVar95._0_8_ = -(ulong)((long)uVar49 < (long)local_148._0_8_);
            auVar95._8_8_ = -(ulong)((long)local_338._8_8_ < (long)local_148._8_8_);
            auVar89._8_4_ = 0xffffffff;
            auVar89._0_8_ = 0xffffffffffffffff;
            auVar89._12_4_ = 0xffffffff;
            auVar63 = auVar89 ^ auVar95 | extraout_XMM0_07;
            if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar63 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar63 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              *(byte *)&ppVar36->flag = (byte)ppVar36->flag | 0x40;
              iVar40 = 0;
              iVar48 = 0;
              iVar56 = 0;
              iVar58 = 0;
              local_33c = 0;
              uVar55 = 0;
            }
            ppVar36->score = iVar40;
            ppVar36->end_query = (int)uVar55;
            ppVar36->end_ref = local_33c;
            ((ppVar36->field_4).stats)->matches = iVar48;
            ((ppVar36->field_4).stats)->similar = iVar56;
            ((ppVar36->field_4).stats)->length = iVar58;
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(b_00);
            parasail_free(b);
            return ppVar36;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar46 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_stats_table_scan_profile_sse41_128_64",pcVar46);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i case0;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            case0 = _mm_cmpeq_epi64(vH, vZero);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm_blendv_epi8(vHM, vZero, case0);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm_blendv_epi8(vHS, vZero, case0);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm_blendv_epi8(vHL, vZero, case0);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m128i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m128i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            __m128i vHM = _mm_load_si128(pvHM + offset);
            __m128i vHS = _mm_load_si128(pvHS + offset);
            __m128i vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int64_t *t = (int64_t*)pvHMax;
        int64_t *m = (int64_t*)pvHMMax;
        int64_t *s = (int64_t*)pvHSMax;
        int64_t *l = (int64_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}